

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_id_getter.cpp
# Opt level: O1

void __thiscall SharedIdGetter::SharedIdGetter(SharedIdGetter *this,uid_t start,uid_t count)

{
  long lVar1;
  SharedMemoryArray<unsigned_int> *this_00;
  SharedMemoryObject<unsigned_long> *this_01;
  int iVar2;
  ulong size;
  long lVar3;
  pointer __p;
  __uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  local_38;
  
  (this->ids_stack_)._M_t.
  super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl =
       (SharedMemoryArray<unsigned_int> *)0x0;
  (this->stack_head_)._M_t.
  super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl =
       (SharedMemoryObject<unsigned_long> *)0x0;
  SharedMutex::SharedMutex(&this->mutex_);
  this_00 = (SharedMemoryArray<unsigned_int> *)operator_new(0x10);
  size = (ulong)count;
  SharedMemoryArray<unsigned_int>::SharedMemoryArray(this_00,size);
  local_38._M_t.
  super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl =
       (tuple<SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
        )(_Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
           *)this,this_00);
  std::
  unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                 *)&local_38);
  this_01 = (SharedMemoryObject<unsigned_long> *)operator_new(8);
  SharedMemoryObject<unsigned_long>::SharedMemoryObject<>(this_01);
  local_38._M_t.
  super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl =
       (tuple<SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
        )(_Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
           *)&this->stack_head_,this_01);
  std::
  unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
                 *)&local_38);
  if (count != 0) {
    lVar1 = (long)((this->ids_stack_)._M_t.
                   super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                   .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl)->
                  ptr_;
    iVar2 = count + start;
    lVar3 = 0;
    do {
      iVar2 = iVar2 + -1;
      *(int *)(lVar1 + lVar3) = iVar2;
      lVar3 = lVar3 + 4;
    } while (size * 4 - lVar3 != 0);
  }
  *((this->stack_head_)._M_t.
    super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
    .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl)->ptr_ = size;
  return;
}

Assistant:

SharedIdGetter::SharedIdGetter(uid_t start, uid_t count) {
    ids_stack_ = std::make_unique<SharedMemoryArray<uid_t>>(count);
    stack_head_ = std::make_unique<SharedMemoryObject<size_t>>();
    for (size_t i = 0; i < count; ++i) {
        (*ids_stack_)[i] = start + count - 1 - i; // Lower the ID is, closer to stack head it is
    }
    (*stack_head_->get()) = count;
}